

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.cpp
# Opt level: O3

void __thiscall csv::internals::IBasicCSVParser::push_field(IBasicCSVParser *this)

{
  size_t *psVar1;
  bool local_11;
  uint local_10;
  uint local_c;
  
  if (this->field_has_double_quote == true) {
    local_c = 0;
    if (this->field_start != 0xffffffff) {
      local_c = this->field_start;
    }
    local_11 = true;
    CSVFieldList::emplace_back<unsigned_int,unsigned_long&,bool>
              (this->fields,&local_c,&this->field_length,&local_11);
    this->field_has_double_quote = false;
  }
  else {
    local_10 = 0;
    if (this->field_start != 0xffffffff) {
      local_10 = this->field_start;
    }
    CSVFieldList::emplace_back<unsigned_int,unsigned_long&>
              (this->fields,&local_10,&this->field_length);
  }
  psVar1 = &(this->current_row).row_length;
  *psVar1 = *psVar1 + 1;
  this->field_start = -1;
  this->field_length = 0;
  return;
}

Assistant:

CSV_INLINE void IBasicCSVParser::push_field()
        {
            // Update
            if (field_has_double_quote) {
                fields->emplace_back(
                    field_start == UNINITIALIZED_FIELD ? 0 : (unsigned int)field_start,
                    field_length,
                    true
                );
                field_has_double_quote = false;

            }
            else {
                fields->emplace_back(
                    field_start == UNINITIALIZED_FIELD ? 0 : (unsigned int)field_start,
                    field_length
                );
            }

            current_row.row_length++;

            // Reset field state
            field_start = UNINITIALIZED_FIELD;
            field_length = 0;
        }